

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

LossLayer * __thiscall CoreML::Specification::LossLayer::New(LossLayer *this,Arena *arena)

{
  LossLayer *this_00;
  
  this_00 = (LossLayer *)operator_new(0x28);
  LossLayer(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LossLayer>(arena,this_00);
  }
  return this_00;
}

Assistant:

LossLayer* LossLayer::New(::google::protobuf::Arena* arena) const {
  LossLayer* n = new LossLayer;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}